

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathExtras.h
# Opt level: O0

uint countLeadingZeros(int x)

{
  uint count;
  uint bits;
  int i;
  int x_local;
  uint local_4;
  
  count = 0x20;
  if (x < 0) {
    local_4 = 0;
  }
  else {
    i = 0x20;
    for (x_local = x; (i = i + -1, i != 0 && (x_local != 0)); x_local = x_local >> 1) {
      count = count - 1;
    }
    local_4 = count;
  }
  return local_4;
}

Assistant:

static inline unsigned int countLeadingZeros(int x)
{
	int i;
	const unsigned bits = sizeof(x) * 8;
	unsigned count = bits;

	if (x < 0) {
		return 0;
	}
	for (i = bits; --i; ) {
		if (x == 0) break;
		count--;
		x >>= 1;
	}

	return count;
}